

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O3

bool __thiscall ON_Font::SetAppleWeightOfFont(ON_Font *this,int apple_weight_of_font)

{
  Weight font_weight;
  bool bVar1;
  ON_wString *src;
  double dVar2;
  ON_wString local_30;
  double local_28;
  
  font_weight = WeightFromWindowsLogfontWeight(apple_weight_of_font * 100);
  local_28 = AppleFontWeightTraitFromWeight(font_weight);
  if ((uint)apple_weight_of_font < 10) {
    dVar2 = (1.0 - (double)apple_weight_of_font) / 7.5;
    local_28 = -1.0;
    if ((-1.0 <= dVar2) && (local_28 = dVar2, 1.0 < dVar2)) {
      local_28 = 1.0;
    }
  }
  bVar1 = ON_wString::IsNotEmpty(&this->m_loc_postscript_name);
  src = &this->m_en_postscript_name;
  if (bVar1) {
    src = &this->m_loc_postscript_name;
  }
  ON_wString::ON_wString(&local_30,src);
  ON_wString::IsEmpty(&local_30);
  bVar1 = Internal_SetFontWeightTrio(this,font_weight,-1,local_28,false);
  ON_wString::~ON_wString(&local_30);
  return bVar1;
}

Assistant:

bool ON_Font::SetAppleWeightOfFont(
  int apple_weight_of_font
)
{
  const ON_Font::Weight font_weight = ON_Font::WeightFromAppleWeightOfFont(apple_weight_of_font);
  double apple_font_weight_trait = ON_Font::AppleFontWeightTraitFromWeight(font_weight);
  if (0 <= apple_weight_of_font && apple_weight_of_font <= 9)
  {
    apple_font_weight_trait = (1.0 - apple_weight_of_font) / 7.5;
    if (apple_font_weight_trait < -1.0)
      apple_font_weight_trait = -1.0;
    else if (apple_font_weight_trait > 1.0)
      apple_font_weight_trait = 1.0;    
  }
  return Internal_SetFontWeightTrio(
    font_weight, 
    -1, 
    apple_font_weight_trait,
    PostScriptName().IsEmpty()
  );
}